

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoDebugger.cpp
# Opt level: O0

bool __thiscall NanoDebugger::disassembleInstruction(NanoDebugger *this,string *instruction)

{
  bool bVar1;
  char *pcVar2;
  string local_2f0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined4 local_70;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string opcode;
  Instruction ins;
  string *instruction_local;
  NanoDebugger *this_local;
  
  bVar1 = NanoVM::fetch(&this->super_NanoVM,(Instruction *)((long)&opcode.field_2 + 8));
  if (bVar1) {
    pcVar2 = instructionStr[(byte)opcode.field_2._M_local_buf[8]];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar2,&local_59);
    std::allocator<char>::~allocator(&local_59);
    if ((opcode.field_2._M_local_buf[8] == '\x1a') || (opcode.field_2._M_local_buf[8] == '\x16')) {
      std::__cxx11::string::operator=((string *)instruction,(string *)local_58);
    }
    else if (((((opcode.field_2._M_local_buf[8] == '\x10') ||
               (opcode.field_2._M_local_buf[8] == '\x11')) ||
              (opcode.field_2._M_local_buf[8] == '\x0f')) ||
             (((opcode.field_2._M_local_buf[8] == '\x0e' ||
               (opcode.field_2._M_local_buf[8] == '\x12')) ||
              ((opcode.field_2._M_local_buf[8] == '\x18' ||
               ((opcode.field_2._M_local_buf[8] == '\x19' ||
                (opcode.field_2._M_local_buf[8] == '\x17')))))))) ||
            ((opcode.field_2._M_local_buf[8] == '\x15' ||
             ((((opcode.field_2._M_local_buf[8] == '\x14' ||
                (opcode.field_2._M_local_buf[8] == '\x1d')) ||
               (opcode.field_2._M_local_buf[8] == '\x1b')) ||
              (opcode.field_2._M_local_buf[8] == '\x1c')))))) {
      if (opcode.field_2._M_local_buf[0xb] == '\0') {
        pcVar2 = " reg";
        if ((opcode.field_2._M_local_buf[0xd] & 1U) != 0) {
          pcVar2 = " @reg";
        }
        std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,pcVar2);
        std::__cxx11::to_string(&local_d0,(uint)(byte)opcode.field_2._M_local_buf[10]);
        std::operator+(&local_90,&local_b0,&local_d0);
        std::__cxx11::string::operator=((string *)instruction,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        pcVar2 = " ";
        if ((opcode.field_2._M_local_buf[0xd] & 1U) != 0) {
          pcVar2 = " @";
        }
        std::operator+(&local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                       ,pcVar2);
        std::__cxx11::to_string(&local_130,ins._0_8_);
        std::operator+(&local_f0,&local_110,&local_130);
        std::__cxx11::string::operator=((string *)instruction,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
      }
    }
    else if (opcode.field_2._M_local_buf[0xb] == '\0') {
      pcVar2 = " reg";
      if ((opcode.field_2._M_local_buf[0xc] & 1U) != 0) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     pcVar2);
      std::__cxx11::to_string(&local_1f0,(uint)(byte)opcode.field_2._M_local_buf[9]);
      std::operator+(&local_1b0,&local_1d0,&local_1f0);
      std::operator+(&local_190,&local_1b0,", ");
      pcVar2 = "reg";
      if ((opcode.field_2._M_local_buf[0xd] & 1U) != 0) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_170,&local_190,pcVar2);
      std::__cxx11::to_string(&local_210,(uint)(byte)opcode.field_2._M_local_buf[10]);
      std::operator+(&local_150,&local_170,&local_210);
      std::__cxx11::string::operator=((string *)instruction,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    else {
      pcVar2 = " reg";
      if ((opcode.field_2._M_local_buf[0xc] & 1U) != 0) {
        pcVar2 = " @reg";
      }
      std::operator+(&local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     pcVar2);
      std::__cxx11::to_string(&local_2d0,(uint)(byte)opcode.field_2._M_local_buf[9]);
      std::operator+(&local_290,&local_2b0,&local_2d0);
      std::operator+(&local_270,&local_290,", ");
      pcVar2 = "";
      if ((opcode.field_2._M_local_buf[0xd] & 1U) != 0) {
        pcVar2 = "@";
      }
      std::operator+(&local_250,&local_270,pcVar2);
      std::__cxx11::to_string(&local_2f0,ins._0_8_);
      std::operator+(&local_230,&local_250,&local_2f0);
      std::__cxx11::string::operator=((string *)instruction,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    this_local._7_1_ = true;
    local_70 = 1;
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool NanoDebugger::disassembleInstruction(std::string &instruction) {
	Instruction ins;
	if (!fetch(ins)) {
		return false;
	}
	std::string opcode = instructionStr[ins.opcode];
	if (ins.opcode == Opcodes::Halt || ins.opcode == Opcodes::Ret) {
		instruction = opcode;
		return true;
	}
	// Single param instructions
	if (ins.opcode == Opcodes::Jg || ins.opcode == Opcodes::Js || ins.opcode == Opcodes::Jnz || ins.opcode == Opcodes::Jz ||
		ins.opcode == Opcodes::Jmp || ins.opcode == Opcodes::Push || ins.opcode == Opcodes::Pop || ins.opcode == Opcodes::Call ||
		ins.opcode == Opcodes::Dec || ins.opcode == Opcodes::Inc || ins.opcode == Opcodes::Printc || ins.opcode == Opcodes::Printi ||
		ins.opcode == Opcodes::Prints) {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isSrcMem) ? " @reg" : " reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isSrcMem) ? " @" : " ") + std::to_string(ins.immediate);
		}
	}
	// two param instruction 
	else {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? " @reg" : "reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? "@" : "") + std::to_string(ins.immediate);
		}
	}
	return true;
}